

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool IsCurrentForFeeEstimation(Chainstate *active_chainstate)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  time_point tVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = ChainstateManager::IsInitialBlockDownload(active_chainstate->m_chainman);
  if (!bVar3) {
    uVar1 = (active_chainstate->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]->nTime;
    tVar4 = NodeClock::now();
    if ((long)tVar4.__d.__r / 1000000000 + -0x2a30 <= (long)(ulong)uVar1) {
      bVar3 = active_chainstate->m_chainman->m_best_header->nHeight <=
              (int)((ulong)((long)(active_chainstate->m_chain).vChain.
                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(active_chainstate->m_chain).vChain.
                                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3);
      goto LAB_00420dac;
    }
  }
  bVar3 = false;
LAB_00420dac:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(cs_main)
{
    AssertLockHeld(cs_main);
    if (active_chainstate.m_chainman.IsInitialBlockDownload()) {
        return false;
    }
    if (active_chainstate.m_chain.Tip()->GetBlockTime() < count_seconds(GetTime<std::chrono::seconds>() - MAX_FEE_ESTIMATION_TIP_AGE))
        return false;
    if (active_chainstate.m_chain.Height() < active_chainstate.m_chainman.m_best_header->nHeight - 1) {
        return false;
    }
    return true;
}